

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1eec638::SatdTestBase<int,_int_(*)(const_int_*,_int)>::Check
          (SatdTestBase<int,_int_(*)(const_int_*,_int)> *this,int expected)

{
  undefined8 *puVar1;
  SEARCH_METHODS *pSVar2;
  bool bVar3;
  internal in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  RegisterStateCheckMMX reg_check_mmx;
  int total_simd;
  int total_ref;
  AssertHelper local_50;
  Message local_48;
  int local_3c;
  RegisterStateCheckMMX local_38;
  int local_18;
  int local_14;
  
  local_38.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
  local_38.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
  local_3c = expected;
  local_38.pre_fpu_env_[4] = in_FPUTagWord;
  local_38.pre_fpu_env_[0]._0_1_ = in_FPUControlWord;
  local_14 = (*this->satd_func_ref_)(this->src_,this->satd_size_);
  libaom_test::RegisterStateCheckMMX::Check(&local_38);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"expected","total_ref",&local_3c,&local_14);
  bVar3 = local_38.pre_fpu_env_[0]._0_1_ == (internal)0x0;
  local_38.pre_fpu_env_[0]._0_1_ = in_FPUControlWord;
  if (bVar3) {
    testing::Message::Message(&local_48);
    puVar1 = (undefined8 *)
             CONCAT44(local_38.pre_fpu_env_._12_4_,
                      CONCAT22(local_38.pre_fpu_env_[5],local_38.pre_fpu_env_[4]));
    if (puVar1 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*puVar1;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x389,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_48.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  puVar1 = (undefined8 *)
           CONCAT44(local_38.pre_fpu_env_._12_4_,
                    CONCAT22(local_38.pre_fpu_env_[5],local_38.pre_fpu_env_[4]));
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  local_38.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
  local_38.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
  local_38.pre_fpu_env_[4] = in_FPUTagWord;
  local_18 = (*this->satd_func_simd_)(this->src_,this->satd_size_);
  libaom_test::RegisterStateCheckMMX::Check(&local_38);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"expected","total_simd",&local_3c,&local_18);
  if (local_38.pre_fpu_env_[0]._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_48);
    puVar1 = (undefined8 *)
             CONCAT44(local_38.pre_fpu_env_._12_4_,
                      CONCAT22(local_38.pre_fpu_env_[5],local_38.pre_fpu_env_[4]));
    if (puVar1 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*puVar1;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x38d,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_48.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  puVar1 = (undefined8 *)
           CONCAT44(local_38.pre_fpu_env_._12_4_,
                    CONCAT22(local_38.pre_fpu_env_[5],local_38.pre_fpu_env_[4]));
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  return;
}

Assistant:

void Check(int expected) {
    int total_ref;
    API_REGISTER_STATE_CHECK(total_ref = satd_func_ref_(src_, satd_size_));
    EXPECT_EQ(expected, total_ref);

    int total_simd;
    API_REGISTER_STATE_CHECK(total_simd = satd_func_simd_(src_, satd_size_));
    EXPECT_EQ(expected, total_simd);
  }